

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O1

void __thiscall Httpdata::handle_http(Httpdata *this,char *buff)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  Httpdata *pHVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  Http_Handle *this_00;
  const_iterator cVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  long *plVar12;
  DIR *__dirp;
  dirent *pdVar13;
  size_t sVar14;
  undefined8 *puVar15;
  ulong *puVar16;
  long *plVar17;
  size_type *psVar18;
  size_type sVar19;
  char cVar20;
  ulong uVar21;
  bool bVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string send_str;
  string body;
  string head;
  int index;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  key_type local_110;
  Http_Handle *local_f0;
  Httpdata *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_c0;
  int local_b4;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  key_type local_70;
  key_type local_50;
  
  local_b4 = 0;
  this_00 = (Http_Handle *)operator_new(0xb8);
  Http_Handle::Http_Handle(this_00);
  handle_request_line(this,buff,&local_b4,this_00);
  local_e8 = this;
  handle_request_head(this,buff,&local_b4,this_00);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Connection","");
  local_c0 = &(this_00->request_head)._M_h;
  cVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(local_c0,&local_110);
  if (cVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar4 = false;
    bVar22 = false;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Connection","");
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)local_c0,&local_50);
    iVar7 = std::__cxx11::string::compare((char *)pmVar10);
    if (iVar7 == 0) {
      bVar22 = true;
      bVar4 = false;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Connection","");
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_c0,&local_70);
      iVar7 = std::__cxx11::string::compare((char *)pmVar10);
      bVar22 = iVar7 == 0;
      bVar4 = true;
    }
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((cVar9.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       ._M_cur != (__node_type *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (bVar22) {
    (local_e8->super_channel).field_0x8c = 1;
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  psVar1 = &this_00->URI;
  iVar7 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar7 == 0) {
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    __dirp = opendir("/source");
    if (__dirp != (DIR *)0x0) {
      local_f0 = this_00;
      while (pdVar13 = readdir(__dirp), pdVar13 != (dirent *)0x0) {
        pcVar11 = pdVar13->d_name;
        iVar7 = strcmp(".",pcVar11);
        if ((iVar7 != 0) && (iVar7 = strcmp("..",pcVar11), iVar7 != 0)) {
          local_90[0] = local_80;
          sVar14 = strlen(pcVar11);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,pcVar11,pcVar11 + sVar14);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x11199d);
          local_e0 = &local_d0;
          plVar17 = plVar12 + 2;
          if ((long *)*plVar12 == plVar17) {
            local_d0 = *plVar17;
            lStack_c8 = plVar12[3];
          }
          else {
            local_d0 = *plVar17;
            local_e0 = (long *)*plVar12;
          }
          local_d8 = plVar12[1];
          *plVar12 = (long)plVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_e0);
          puVar16 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar16) {
            local_120 = *puVar16;
            lStack_118 = plVar12[3];
            local_130 = &local_120;
          }
          else {
            local_120 = *puVar16;
            local_130 = (ulong *)*plVar12;
          }
          local_128 = plVar12[1];
          *plVar12 = (long)puVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          local_b0 = local_a0;
          sVar14 = strlen(pcVar11);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,pcVar11,pcVar11 + sVar14);
          uVar21 = 0xf;
          if (local_130 != &local_120) {
            uVar21 = local_120;
          }
          if (uVar21 < (ulong)(local_a8 + local_128)) {
            uVar21 = 0xf;
            if (local_b0 != local_a0) {
              uVar21 = local_a0[0];
            }
            if (uVar21 < (ulong)(local_a8 + local_128)) goto LAB_0010ddf5;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_130)
            ;
          }
          else {
LAB_0010ddf5:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_b0);
          }
          local_190 = &local_180;
          plVar12 = puVar15 + 2;
          if ((long *)*puVar15 == plVar12) {
            local_180 = *plVar12;
            lStack_178 = puVar15[3];
          }
          else {
            local_180 = *plVar12;
            local_190 = (long *)*puVar15;
          }
          local_188 = puVar15[1];
          *puVar15 = plVar12;
          puVar15[1] = 0;
          *(undefined1 *)plVar12 = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_190);
          psVar18 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_170.field_2._M_allocated_capacity = *psVar18;
            local_170.field_2._8_8_ = plVar12[3];
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          }
          else {
            local_170.field_2._M_allocated_capacity = *psVar18;
            local_170._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_170._M_string_length = plVar12[1];
          *plVar12 = (long)psVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_170._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          if (local_190 != &local_180) {
            operator_delete(local_190);
          }
          if (local_b0 != local_a0) {
            operator_delete(local_b0);
          }
          if (local_130 != &local_120) {
            operator_delete(local_130);
          }
          if (local_e0 != &local_d0) {
            operator_delete(local_e0);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
        }
      }
      closedir(__dirp);
      this_00 = local_f0;
    }
    std::__cxx11::string::append((char *)&local_150);
    paVar2 = &local_170.field_2;
    pcVar3 = (this_00->_version)._M_dataplus._M_p;
    local_170._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar3,pcVar3 + (this_00->_version)._M_string_length);
    std::__cxx11::string::append((char *)&local_170);
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    cVar20 = '\x01';
    if (9 < local_150._M_string_length) {
      sVar19 = local_150._M_string_length;
      cVar6 = '\x04';
      do {
        cVar20 = cVar6;
        if (sVar19 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_0010e515;
        }
        if (sVar19 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_0010e515;
        }
        if (sVar19 < 10000) goto LAB_0010e515;
        bVar4 = 99999 < sVar19;
        sVar19 = sVar19 / 10000;
        cVar6 = cVar20 + '\x04';
      } while (bVar4);
      cVar20 = cVar20 + '\x01';
    }
LAB_0010e515:
    local_130 = &local_120;
    std::__cxx11::string::_M_construct((ulong)&local_130,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_130,(uint)local_128,local_150._M_string_length);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x1119f0);
    plVar17 = plVar12 + 2;
    if ((long *)*plVar12 == plVar17) {
      local_180 = *plVar17;
      lStack_178 = plVar12[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar17;
      local_190 = (long *)*plVar12;
    }
    local_188 = plVar12[1];
    *plVar12 = (long)plVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
    psVar18 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_170.field_2._M_allocated_capacity = *psVar18;
      local_170.field_2._8_8_ = puVar15[3];
      local_170._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar18;
      local_170._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_170._M_string_length = puVar15[1];
    *puVar15 = psVar18;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130);
    }
    std::__cxx11::string::append((char *)&local_110);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar7 == 0) {
      std::__cxx11::string::append((char *)&local_150);
      std::__cxx11::string::append((char *)&local_150);
      std::__cxx11::string::append((char *)&local_150);
      std::__cxx11::string::append((char *)&local_150);
      paVar2 = &local_170.field_2;
      pcVar3 = (this_00->_version)._M_dataplus._M_p;
      local_170._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + (this_00->_version)._M_string_length);
      std::__cxx11::string::append((char *)&local_170);
      std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)&local_110);
      std::__cxx11::string::append((char *)&local_110);
      cVar20 = '\x01';
      if (9 < local_150._M_string_length) {
        sVar19 = local_150._M_string_length;
        cVar6 = '\x04';
        do {
          cVar20 = cVar6;
          if (sVar19 < 100) {
            cVar20 = cVar20 + -2;
            goto LAB_0010e7a6;
          }
          if (sVar19 < 1000) {
            cVar20 = cVar20 + -1;
            goto LAB_0010e7a6;
          }
          if (sVar19 < 10000) goto LAB_0010e7a6;
          bVar4 = 99999 < sVar19;
          sVar19 = sVar19 / 10000;
          cVar6 = cVar20 + '\x04';
        } while (bVar4);
        cVar20 = cVar20 + '\x01';
      }
LAB_0010e7a6:
      local_130 = &local_120;
      std::__cxx11::string::_M_construct((ulong)&local_130,cVar20);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_130,(uint)local_128,local_150._M_string_length);
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x1119f0);
      plVar12 = puVar15 + 2;
      if ((long *)*puVar15 == plVar12) {
        local_180 = *plVar12;
        lStack_178 = puVar15[3];
        local_190 = &local_180;
      }
      else {
        local_180 = *plVar12;
        local_190 = (long *)*puVar15;
      }
      local_188 = puVar15[1];
      *puVar15 = plVar12;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
      psVar18 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_170.field_2._M_allocated_capacity = *psVar18;
        local_170.field_2._8_8_ = puVar15[3];
        local_170._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar18;
        local_170._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_170._M_string_length = puVar15[1];
      *puVar15 = psVar18;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_170._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != paVar2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (local_190 != &local_180) {
        operator_delete(local_190);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130);
      }
      std::__cxx11::string::append((char *)&local_110);
    }
    else {
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      pcVar3 = (this_00->URI)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + (this_00->URI)._M_string_length);
      iVar7 = open(local_170._M_dataplus._M_p,0);
      if (iVar7 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"openfail",8);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
      local_f0 = this_00;
      if ((iVar7 < 1) ||
         (pcVar11 = (char *)mmap((void *)0x0,0x1000,1,1,iVar7,0),
         pcVar11 == (char *)0xffffffffffffffff)) {
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::append((char *)&local_150);
        pcVar3 = (local_f0->_version)._M_dataplus._M_p;
        local_190 = &local_180;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,pcVar3,pcVar3 + (local_f0->_version)._M_string_length);
        std::__cxx11::string::append((char *)&local_190);
        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_190);
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        std::__cxx11::string::append((char *)&local_110);
        std::__cxx11::string::append((char *)&local_110);
        cVar20 = '\x01';
        if (9 < local_150._M_string_length) {
          sVar19 = local_150._M_string_length;
          cVar6 = '\x04';
          do {
            cVar20 = cVar6;
            if (sVar19 < 100) {
              cVar20 = cVar20 + -2;
              goto LAB_0010e65e;
            }
            if (sVar19 < 1000) {
              cVar20 = cVar20 + -1;
              goto LAB_0010e65e;
            }
            if (sVar19 < 10000) goto LAB_0010e65e;
            bVar4 = 99999 < sVar19;
            sVar19 = sVar19 / 10000;
            cVar6 = cVar20 + '\x04';
          } while (bVar4);
          cVar20 = cVar20 + '\x01';
        }
LAB_0010e65e:
        local_e0 = &local_d0;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar20);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_e0,(uint)local_d8,local_150._M_string_length);
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x1119f0);
        puVar16 = puVar15 + 2;
        if ((ulong *)*puVar15 == puVar16) {
          local_120 = *puVar16;
          lStack_118 = puVar15[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *puVar16;
          local_130 = (ulong *)*puVar15;
        }
        local_128 = puVar15[1];
        *puVar15 = puVar16;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        plVar12 = puVar15 + 2;
        if ((long *)*puVar15 == plVar12) {
          local_180 = *plVar12;
          lStack_178 = puVar15[3];
          local_190 = &local_180;
        }
        else {
          local_180 = *plVar12;
          local_190 = (long *)*puVar15;
        }
        local_188 = puVar15[1];
        *puVar15 = plVar12;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_190);
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0);
        }
        std::__cxx11::string::append((char *)&local_110);
      }
      else {
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)psVar1);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x111aa4);
        puVar16 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar16) {
          local_120 = *puVar16;
          lStack_118 = plVar12[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *puVar16;
          local_130 = (ulong *)*plVar12;
        }
        local_128 = plVar12[1];
        *plVar12 = (long)puVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_130);
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_180 = *plVar17;
          lStack_178 = plVar12[3];
          local_190 = &local_180;
        }
        else {
          local_180 = *plVar17;
          local_190 = (long *)*plVar12;
        }
        local_188 = plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_190);
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0);
        }
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::append((char *)&local_150);
        std::__cxx11::string::string((string *)&local_190,pcVar11,(allocator *)&local_130);
        std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_190);
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        std::__cxx11::string::append((char *)&local_150);
        pcVar3 = (local_f0->_version)._M_dataplus._M_p;
        local_190 = &local_180;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,pcVar3,pcVar3 + (local_f0->_version)._M_string_length);
        std::__cxx11::string::append((char *)&local_190);
        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_190);
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        std::__cxx11::string::append((char *)&local_110);
        std::__cxx11::string::append((char *)&local_110);
        cVar20 = '\x01';
        if (9 < local_150._M_string_length) {
          sVar19 = local_150._M_string_length;
          cVar6 = '\x04';
          do {
            cVar20 = cVar6;
            if (sVar19 < 100) {
              cVar20 = cVar20 + -2;
              goto LAB_0010e8e7;
            }
            if (sVar19 < 1000) {
              cVar20 = cVar20 + -1;
              goto LAB_0010e8e7;
            }
            if (sVar19 < 10000) goto LAB_0010e8e7;
            bVar4 = 99999 < sVar19;
            sVar19 = sVar19 / 10000;
            cVar6 = cVar20 + '\x04';
          } while (bVar4);
          cVar20 = cVar20 + '\x01';
        }
LAB_0010e8e7:
        local_e0 = &local_d0;
        std::__cxx11::string::_M_construct((ulong)&local_e0,cVar20);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_e0,(uint)local_d8,local_150._M_string_length);
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x1119f0);
        puVar16 = puVar15 + 2;
        if ((ulong *)*puVar15 == puVar16) {
          local_120 = *puVar16;
          lStack_118 = puVar15[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *puVar16;
          local_130 = (ulong *)*puVar15;
        }
        local_128 = puVar15[1];
        *puVar15 = puVar16;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
        plVar12 = puVar15 + 2;
        if ((long *)*puVar15 == plVar12) {
          local_180 = *plVar12;
          lStack_178 = puVar15[3];
          local_190 = &local_180;
        }
        else {
          local_180 = *plVar12;
          local_190 = (long *)*puVar15;
        }
        local_188 = puVar15[1];
        *puVar15 = plVar12;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_190);
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0);
        }
        std::__cxx11::string::append((char *)&local_110);
        iVar8 = munmap(pcVar11,0x1000);
        if (iVar8 != 0) {
          __assert_fail("munmap((void*)ptr,4096) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/Httpdata.cpp"
                        ,0x88,"void Httpdata::handle_http(char *)");
        }
        close(iVar7);
      }
      this_00 = local_f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
        this_00 = local_f0;
      }
    }
  }
  pcVar3 = (this_00->request_body)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this_00->request_body).field_2) {
    operator_delete(pcVar3);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_c0);
  pcVar3 = (this_00->URI)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this_00->URI).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this_00->_version)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this_00->_version).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this_00->Req)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this_00->Req).field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(this_00);
  std::operator+(&local_170,&local_110,&local_150);
  pHVar5 = local_e8;
  strcpy((local_e8->super_channel).write_buff,local_170._M_dataplus._M_p);
  (pHVar5->super_channel).write_length = (int)local_170._M_string_length;
  (*(pHVar5->super_channel)._vptr_channel[5])(pHVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Httpdata::handle_http(char *buff)
{
    int index = 0;
    Http_Handle *Recv_Http = new Http_Handle();
    handle_request_line(buff,index,Recv_Http);
    handle_request_head(buff,index,Recv_Http);
    if(Recv_Http->request_head.count("Connection") != 0 &&  
        (Recv_Http->request_head["Connection"] == "keep-alive" || 
        Recv_Http->request_head["Connection"] == "Keep-Alive") )
    {
        Keep_Alive = true;
    }
    string head = "";
    string body = "";
    //if(Recv_Http->URI == "222")
    if(Recv_Http->URI == "/")
    {
        body += "<html><title>Source Page</title>";
        body += "<body bgcolor=\"ffffff\">";
        body += "!Thank for visiting MRWu_haha's Server!";
        body += "<meta http-equiv=\"Content-Type\" content=\"text/html; charset=utf-8\" />";
        body += "<br><a href=\"http://www.baidu.com\">百度一下</a>";
        body += "<br><a href=\"https://join.qq.com\">腾讯招聘</a>";
        body += "<br><a href=\"https://campus.kuaishou.cn\">快手招聘</a>";
        body += "<br><a href=\"https://uniportal.huawei.com\">华为招聘</a>";
        body += "<br><a href=\"https://campus.163.com\">网易招聘</a>";
        body += "<br><a href=\"https://careers.pinduoduo.com\">拼多多招聘</a>";
        body += "<br><a href=\"https://campus.alibaba.com\">阿里巴巴招聘</a>";
        body += "<br><a href=\"https://campus.bigo.sg\">BIGO招聘</a><br>";
        body += "<font size=\"5\"> MR-Wuhaha's Source Flie List: </font><br/>";
        DIR* source = opendir("/source");
        if(source != nullptr)
        {
            dirent* p_entry = nullptr;
            while((p_entry = readdir(source)) != nullptr)
            {
                if(!(p_entry->d_type & S_IFDIR) && (strcmp(".", p_entry->d_name) != 0 && strcmp("..", p_entry->d_name) != 0))
                {
                    body += "<br><a href=\"/source/" + string(p_entry->d_name) + "\">" + string(p_entry->d_name) + "</a>";
                }
            }
            closedir(source);
        }

        body += "</body></html>";
        head += Recv_Http->_version + " 200 OK\r\n";
        head += "Connection: Keep-Alive\r\n";
        head += "Content-type: text/html\r\n";
        head += "Content-Length: " + to_string(body.size()) + "\r\n";
        head += "\r\n";
    }
    else if(Recv_Http->URI == "/hello")
    {
        body += "<html><title>Hello</title>";
        body += "<body bgcolor=\"ffffff\">";
        body += "Thank for visiting this server!!!!";
        body += "<hr><em> MR_Wuhaha's WebServer </em>\n</body></html>";
        head += Recv_Http->_version + " 200 OK\r\n";
        head += "Connection: Keep-Alive\r\n";
        head += "Content-Type: text/html\r\n";
        head += "Content-Length: " + to_string(body.size()) + "\r\n";
        head += "\r\n";
    }
    else
    {
        string request_file_name = Recv_Http->URI;
        int request_fd = open(request_file_name.c_str(),O_RDONLY);
        if(request_fd < 0)
        {
            cout<<"openfail"<<endl;
        }
        char* ptr = nullptr;
        if(request_fd > 0 && (ptr = (char*)mmap(NULL,4096,PROT_READ,MAP_SHARED,request_fd,0)) != MAP_FAILED)
        {
            body += "<html>";
            body += "<title>" + Recv_Http->URI.substr(1) +  "</title>";
            body += "<head>";
            body += "<meta http-equiv=\"content-type\" content=\"text/html; charset=utf-8\">";
            body += "</head>";
            body += "<body bgcolor=\"ffffff\">";
            body += "MR_Wuhaha's WebServer";
            body += "<hr><pre style=\"word-wrap: break-word; white-space: pre-wrap; white-space: -moz-pre-wrap\">";
            body += string(ptr);
            body += "</pre>\n</body></html>";
            head += Recv_Http->_version + " 200 OK\r\n";
            head += "Connection: Keep-Alive\r\n";
            head += "Content-Type: text/html\r\n";
            head += "Content-Length: " + to_string(body.size()) + "\r\n";
            head += "\r\n";
            assert(munmap((void*)ptr,4096) == 0);
            close(request_fd);
        }
        else
        {
            body += "<html><title>Source Not Found</title>";
            body += "<body bgcolor=\"ffffff\">";
            body += "404 NOT_FOUND";
            body += "<hr><em> MR_Wuhaha's WebServer </em>\n</body></html>";
            head += Recv_Http->_version + " 404 NOTFOUND\r\n";
            head += "Connection: Keep-Alive\r\n";
            head += "Content-Type: text/html\r\n";
            head += "Content-Length: " + to_string(body.size()) + "\r\n";
            head += "\r\n";
        }
    }
    delete Recv_Http;
    string send_str = head + body;
    sprintf(write_buff, "%s", send_str.c_str());
    write_length = send_str.length();
    HandleWrite();
}